

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.h
# Opt level: O1

void __thiscall Jupiter::Config::~Config(Config *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_Config = (_func_int **)&PTR_read_internal_00147168;
  std::
  unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config,_jessilib::text_hashi,_jessilib::text_equali,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jupiter::Config>_>_>_>_>
  ::~unique_ptr(&this->m_sections);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_jessilib::text_equali,_jessilib::text_hashi,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->m_table)._M_h);
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  paVar2 = &(this->m_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

class JUPITER_API Config
	{
	public:
		/** Hash_Table type for sections */
		using SectionHashTable = std::unordered_map<std::string, Config, jessilib::text_hashi, jessilib::text_equali>;
		using ValuesHashTable = std::unordered_map<std::string, std::string, jessilib::text_hashi, jessilib::text_equali>;
		using InKeyType = InMapKeyType;

		Config() = default;
		Config(const Config& in_config);
		Config(Config&& in_config) = default;
		Config& operator=(const Config& in_config);
		Config& operator=(Config&& in_config) = default;

		/**
		* @brief Fetches the value of an entry.
		*
		* @param in_key Key of the entry to fetch
		* @param in_default_value Value to return if no such entry exists
		* @return Value of the entry if it exists, an empty string otherwise.
		*/
		std::string_view get(std::string_view in_key, std::string_view in_default_value = std::string_view{}) const;

		/**
		* @brief Fetches the value of an entry and interprets it as another type.
		*
		* @param T Type to interpret the value as
		*
		* @param in_key Key of the entry to fetch
		* @param in_default_value Value to return if no such entry exists
		* @return Value of the entry if it exists, 0 otherwise.
		*/
		template<typename T> T get(std::string_view in_key, T in_default_value = 0) const;

		/**
		* @brief Fetches a section based on its name
		*
		* @param in_key Name of the section to fetch
		* @return Pointer to a section if it exists, nullptr otherwise
		*/
		Config *getSection(std::string_view in_key) const;

		/**
		* @brief Fetches a section based on its name
		* Note: This will create new sections as necessary if they do not exist
		*
		* @param in_key Name of the section to fetch
		* @return Reference to the section
		*/
		Config &getSectionReference(std::string_view in_key);

		/**
		* @brief Sets an entry's value in the table
		*
		* @param in_key Key of the entry to write to
		* @param in_value Value to write to the entry
		* @return True if a new entry was added, false if an entry was overwritten
		*/
		bool set(std::string_view in_key, std::string in_value);

		/**
		* @brief Removes an entry from the table
		*
		* @param in_key Key of the entry to remove
		* @return True if an entry was removed, false otherwise
		*/
		bool remove(std::string_view in_key);

		/**
		* @brief Removes a section from the table
		*
		* @param in_key Key of the section to remove
		* @return True if an entry was removed, false otherwise
		*/
		bool removeSection(std::string_view in_key);

		/**
		* @brief Fetches the name of this config section
		* Note: This is the filename on the root node
		*
		* @return Name of this section
		*/
		const std::string& getName() const;

		/**
		* @brief Erases all data from this section
		*/
		void erase();

		/**
		* @brief Reads config data from a file and stores it in this config
		*
		* @param in_filename Name of the file to read from
		* @return True on success, false otherwise
		*/
		bool read(const char *in_filename);

		/**
		* @brief Reads config data from a file and stores it in this config
		*
		* @param in_filename Name of the file to read from
		* @return True on success, false otherwise
		*/
		bool read(std::string_view in_filename);

		/**
		* @brief Writes config data to the last read file
		*
		* @return True on success, false otherwise
		*/
		bool write();

		/**
		* @brief Writes config data to a file
		*
		* @param in_filename Name of the file to write to
		* @return True on success, false otherwise
		*/
		bool write(const char *in_filename);

		/**
		* @brief Writes config data to a file
		*
		* @param in_filename Name of the file to write to
		* @return True on success, false otherwise
		*/
		bool write(std::string_view in_filename);

		/**
		* @brief Empties config data from memory and reads from the last read file
		*
		* @return True on success, false otherwise
		*/
		bool reload();

		/**
		* @brief Empties config data from memory and reads from a file
		*
		* @param in_filename Name of the file to read from
		* @return True on success, false otherwise
		*/
		bool reload(const char *in_filename);

		/**
		* @brief Empties config data from memory and reads from a file
		*
		* @param in_filename Name of the file to read from
		* @return True on success, false otherwise
		*/
		bool reload(std::string_view in_filename);

		/**
		* @brief Fetches a reference to this config's entry table
		*
		* @return Reference to m_table
		*/
		inline const ValuesHashTable &getTable() const { return m_table; }

		/**
		* @brief Fetches a reference to this config's subsections
		*
		* @return Reference to m_sections
		*/
		const SectionHashTable &getSections() const;

		/** Subscript operator */
		Config &operator[](std::string_view in_key);

	protected:
		virtual bool read_internal(const char *in_filename);
		virtual bool write_internal(const char *in_filename);

		/** Name of this Config section. This is empty or the filename at the root level. */
		std::string m_name;

		/** Table of entries within this section */
		ValuesHashTable m_table;

		/** Table of sections within this section */
		std::unique_ptr<SectionHashTable> m_sections;
	}